

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O1

int Io_ReadBlifNetworkConnectBoxesOneBox(Io_ReadBlif_t *p,Abc_Obj_t *pBox,stmm_table *tName2Model)

{
  void *pvVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  undefined8 uVar7;
  long lVar8;
  char *__s;
  char *pcVar9;
  void *pvVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  Abc_Ntk_t *pNtkModel;
  Abc_Ntk_t *local_40;
  Io_ReadBlif_t *local_38;
  
  pvVar10 = (pBox->field_5).pData;
  if (*(int *)((long)pvVar10 + 4) < 1) {
LAB_0032e01f:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  iVar2 = stmm_lookup(tName2Model,(char *)**(undefined8 **)((long)pvVar10 + 8),(char **)&local_40);
  if (iVar2 == 0) {
    p->LineCur = (pBox->field_6).iTemp;
    if (0 < *(int *)((long)pvVar10 + 4)) {
      pcVar12 = p->sError;
      __s = (char *)**(undefined8 **)((long)pvVar10 + 8);
      pcVar9 = "Cannot find the model for subcircuit %s.";
      goto LAB_0032dff1;
    }
    goto LAB_0032e01f;
  }
  pVVar6 = local_40->vPis;
  iVar2 = pVVar6->nSize;
  if (0 < iVar2) {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)pVVar6->pArray[lVar8] + 0x40) = 0;
      lVar8 = lVar8 + 1;
      pVVar6 = local_40->vPis;
      iVar2 = pVVar6->nSize;
    } while (lVar8 < iVar2);
  }
  local_38 = p;
  if (iVar2 == 0) {
    uVar11 = 1;
  }
  else {
    uVar11 = 0xffffffff;
    if (1 < *(int *)((long)pvVar10 + 4)) {
      uVar13 = 1;
      do {
        __s = *(char **)(*(long *)((long)pvVar10 + 8) + uVar13 * 8);
        sVar3 = strlen(__s);
        if (0 < (int)(uint)sVar3) {
          uVar4 = (ulong)((uint)sVar3 & 0x7fffffff);
          pcVar12 = __s;
          do {
            pcVar9 = pcVar12 + 1;
            if (*pcVar12 == '=') goto LAB_0032dbde;
            uVar4 = uVar4 - 1;
            pcVar12 = pcVar9;
          } while (uVar4 != 0);
        }
        pcVar9 = (char *)0x0;
LAB_0032dbde:
        if (pcVar9 == (char *)0x0) goto LAB_0032defc;
        iVar2 = ~(uint)__s + (int)pcVar9;
        __s[iVar2] = '\0';
        pAVar5 = Abc_NtkFindNet(local_40,__s);
        if (pAVar5 == (Abc_Obj_t *)0x0) {
          local_38->LineCur = (pBox->field_6).iTemp;
          if (*(int *)((long)pvVar10 + 4) < 1) goto LAB_0032e01f;
          pcVar12 = local_38->sError;
          uVar7 = **(undefined8 **)((long)pvVar10 + 8);
          pcVar9 = "Cannot find formal input \"%s\" as an PI of model \"%s\".";
          goto LAB_0032dfc1;
        }
        pvVar1 = pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
        if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) != 2) {
          __s[iVar2] = '=';
LAB_0032e017:
          uVar11 = (uint)uVar13;
          break;
        }
        if (*(long *)((long)pvVar1 + 0x40) != 0) {
          local_38->LineCur = (pBox->field_6).iTemp;
          pcVar12 = local_38->sError;
          pcVar9 = "Formal input \"%s\" is used more than once.";
          p = local_38;
          goto LAB_0032dff1;
        }
        *(char **)((long)pvVar1 + 0x40) = pcVar9;
        if (uVar13 == (uint)local_40->vPis->nSize) {
          uVar13 = (ulong)((int)uVar13 + 1);
          goto LAB_0032e017;
        }
        uVar13 = uVar13 + 1;
        uVar11 = 0xffffffff;
      } while ((long)uVar13 < (long)*(int *)((long)pvVar10 + 4));
      goto LAB_0032dca3;
    }
  }
  __s = (char *)0x0;
LAB_0032dca3:
  pVVar6 = local_40->vPis;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      pcVar12 = *(char **)((long)pVVar6->pArray[lVar8] + 0x40);
      if (pcVar12 == (char *)0x0) {
        local_38->LineCur = (pBox->field_6).iTemp;
        if (*(int *)((long)pvVar10 + 4) < 1) goto LAB_0032e01f;
        pcVar12 = local_38->sError;
        uVar7 = **(undefined8 **)((long)pvVar10 + 8);
        pcVar9 = "Formal input \"%s\" of model %s is not driven.";
        goto LAB_0032dfc1;
      }
      pAVar5 = Abc_NtkFindOrCreateNet(pBox->pNtk,pcVar12);
      Abc_ObjAddFanin(pBox,pAVar5);
      lVar8 = lVar8 + 1;
      pVVar6 = local_40->vPis;
    } while (lVar8 < pVVar6->nSize);
  }
  pVVar6 = local_40->vPis;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)pVVar6->pArray[lVar8] + 0x40) = 0;
      lVar8 = lVar8 + 1;
      pVVar6 = local_40->vPis;
    } while (lVar8 < pVVar6->nSize);
  }
  pVVar6 = local_40->vPos;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)pVVar6->pArray[lVar8] + 0x40) = 0;
      lVar8 = lVar8 + 1;
      pVVar6 = local_40->vPos;
    } while (lVar8 < pVVar6->nSize);
  }
  if ((int)uVar11 < *(int *)((long)pvVar10 + 4)) {
    uVar13 = (ulong)uVar11;
    do {
      if ((int)uVar11 < 0) goto LAB_0032e01f;
      __s = *(char **)(*(long *)((long)pvVar10 + 8) + uVar13 * 8);
      sVar3 = strlen(__s);
      if (0 < (int)(uint)sVar3) {
        uVar4 = (ulong)((uint)sVar3 & 0x7fffffff);
        pcVar12 = __s;
        do {
          pcVar9 = pcVar12 + 1;
          if (*pcVar12 == '=') goto LAB_0032dd8d;
          uVar4 = uVar4 - 1;
          pcVar12 = pcVar9;
        } while (uVar4 != 0);
      }
      pcVar9 = (char *)0x0;
LAB_0032dd8d:
      if (pcVar9 == (char *)0x0) goto LAB_0032defc;
      __s[(int)(~(uint)__s + (int)pcVar9)] = '\0';
      pAVar5 = Abc_NtkFindNet(local_40,__s);
      if (pAVar5 == (Abc_Obj_t *)0x0) {
        local_38->LineCur = (pBox->field_6).iTemp;
        if (*(int *)((long)pvVar10 + 4) < 1) goto LAB_0032e01f;
        pcVar12 = local_38->sError;
        uVar7 = **(undefined8 **)((long)pvVar10 + 8);
        pcVar9 = "Cannot find formal output \"%s\" as an PO of model \"%s\".";
        goto LAB_0032dfc1;
      }
      pvVar1 = pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
      if (*(long *)((long)pvVar1 + 0x40) != 0) {
        local_38->LineCur = (pBox->field_6).iTemp;
        pcVar12 = local_38->sError;
        pcVar9 = "Formal output \"%s\" is used more than once.";
        p = local_38;
        goto LAB_0032dff1;
      }
      *(char **)((long)pvVar1 + 0x40) = pcVar9;
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < *(int *)((long)pvVar10 + 4));
  }
  pVVar6 = local_40->vPos;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      pcVar12 = *(char **)((long)pVVar6->pArray[lVar8] + 0x40);
      if (pcVar12 == (char *)0x0) {
        local_38->LineCur = (pBox->field_6).iTemp;
        if (0 < *(int *)((long)pvVar10 + 4)) {
          pcVar12 = local_38->sError;
          uVar7 = **(undefined8 **)((long)pvVar10 + 8);
          pcVar9 = "Formal output \"%s\" of model %s is not driven.";
LAB_0032dfc1:
          p = local_38;
          sprintf(pcVar12,pcVar9,__s,uVar7);
          goto LAB_0032dff8;
        }
        goto LAB_0032e01f;
      }
      pAVar5 = Abc_NtkFindOrCreateNet(pBox->pNtk,pcVar12);
      Abc_ObjAddFanin(pAVar5,pBox);
      lVar8 = lVar8 + 1;
      pVVar6 = local_40->vPos;
    } while (lVar8 < pVVar6->nSize);
  }
  pVVar6 = local_40->vPos;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)pVVar6->pArray[lVar8] + 0x40) = 0;
      lVar8 = lVar8 + 1;
      pVVar6 = local_40->vPos;
    } while (lVar8 < pVVar6->nSize);
  }
  pvVar10 = (pBox->field_5).pData;
  if (0 < *(int *)((long)pvVar10 + 4)) {
    lVar8 = 0;
    do {
      pvVar10 = *(void **)(*(long *)((long)pvVar10 + 8) + lVar8 * 8);
      if (pvVar10 != (void *)0x0) {
        free(pvVar10);
      }
      lVar8 = lVar8 + 1;
      pvVar10 = (pBox->field_5).pData;
    } while (lVar8 < *(int *)((long)pvVar10 + 4));
  }
  if (*(void **)((long)pvVar10 + 8) != (void *)0x0) {
    free(*(void **)((long)pvVar10 + 8));
    *(undefined8 *)((long)pvVar10 + 8) = 0;
  }
  if (pvVar10 != (void *)0x0) {
    free(pvVar10);
  }
  (pBox->field_5).pData = local_40;
  return 0;
LAB_0032defc:
  local_38->LineCur = (pBox->field_6).iTemp;
  pcVar12 = local_38->sError;
  pcVar9 = "Cannot parse formal/actual name pair \"%s\".";
  p = local_38;
LAB_0032dff1:
  sprintf(pcVar12,pcVar9,__s);
LAB_0032dff8:
  Io_ReadBlifPrintErrorMessage(p);
  return 1;
}

Assistant:

int Io_ReadBlifNetworkConnectBoxesOneBox( Io_ReadBlif_t * p, Abc_Obj_t * pBox, stmm_table * tName2Model )
{
    Vec_Ptr_t * pNames;
    Abc_Ntk_t * pNtkModel;
    Abc_Obj_t * pObj, * pNet;
    char * pName = NULL, * pActual;
    int i, Length, Start = -1;

    // get the model for this box
    pNames = (Vec_Ptr_t *)pBox->pData;
    if ( !stmm_lookup( tName2Model, (char *)Vec_PtrEntry(pNames, 0), (char **)&pNtkModel ) )
    {
        p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
        sprintf( p->sError, "Cannot find the model for subcircuit %s.", (char*)Vec_PtrEntry(pNames, 0) );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }

    // create the fanins of the box
    Abc_NtkForEachPi( pNtkModel, pObj, i )
        pObj->pCopy = NULL;
    if ( Abc_NtkPiNum(pNtkModel) == 0 )
        Start = 1;
    else
    {
        Vec_PtrForEachEntryStart( char *, pNames, pName, i, 1 )
        {
            pActual = Io_ReadBlifCleanName(pName);
            if ( pActual == NULL )
            {
                p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
                sprintf( p->sError, "Cannot parse formal/actual name pair \"%s\".", pName );
                Io_ReadBlifPrintErrorMessage( p );
                return 1;
            }
            Length = pActual - pName - 1;
            pName[Length] = 0;
            // find the PI net with this name
            pObj = Abc_NtkFindNet( pNtkModel, pName );
            if ( pObj == NULL )
            {
                p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
                sprintf( p->sError, "Cannot find formal input \"%s\" as an PI of model \"%s\".", pName, (char*)Vec_PtrEntry(pNames, 0) );
                Io_ReadBlifPrintErrorMessage( p );
                return 1;
            }
            // get the PI
            pObj = Abc_ObjFanin0(pObj);
            // quit if this is not a PI net
            if ( !Abc_ObjIsPi(pObj) )
            {
                pName[Length] = '=';
                Start = i;
                break;
            }
            // remember the actual name in the net
            if ( pObj->pCopy != NULL )
            {
                p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
                sprintf( p->sError, "Formal input \"%s\" is used more than once.", pName );
                Io_ReadBlifPrintErrorMessage( p );
                return 1;
            }
            pObj->pCopy = (Abc_Obj_t *)pActual;
            // quit if we processed all PIs
            if ( i == Abc_NtkPiNum(pNtkModel) )
            {
                Start = i+1;
                break;
            }
        }
    }
    // create the fanins of the box
    Abc_NtkForEachPi( pNtkModel, pObj, i )
    {
        pActual = (char *)pObj->pCopy;
        if ( pActual == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Formal input \"%s\" of model %s is not driven.", pName, (char*)Vec_PtrEntry(pNames, 0) );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        pNet = Abc_NtkFindOrCreateNet( pBox->pNtk, pActual );
        Abc_ObjAddFanin( pBox, pNet );
    }
    Abc_NtkForEachPi( pNtkModel, pObj, i )
        pObj->pCopy = NULL;

    // create the fanouts of the box
    Abc_NtkForEachPo( pNtkModel, pObj, i )
        pObj->pCopy = NULL;
    Vec_PtrForEachEntryStart( char *, pNames, pName, i, Start )
    {
        pActual = Io_ReadBlifCleanName(pName);
        if ( pActual == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Cannot parse formal/actual name pair \"%s\".", pName );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        Length = pActual - pName - 1;
        pName[Length] = 0;
        // find the PO net with this name
        pObj = Abc_NtkFindNet( pNtkModel, pName );
        if ( pObj == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Cannot find formal output \"%s\" as an PO of model \"%s\".", pName, (char*)Vec_PtrEntry(pNames, 0) );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        // get the PO
        pObj = Abc_ObjFanout0(pObj);
        if ( pObj->pCopy != NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Formal output \"%s\" is used more than once.", pName );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        pObj->pCopy = (Abc_Obj_t *)pActual;
    }
    // create the fanouts of the box
    Abc_NtkForEachPo( pNtkModel, pObj, i )
    {
        pActual = (char *)pObj->pCopy;
        if ( pActual == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Formal output \"%s\" of model %s is not driven.", pName, (char*)Vec_PtrEntry(pNames, 0) );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        pNet = Abc_NtkFindOrCreateNet( pBox->pNtk, pActual );
        Abc_ObjAddFanin( pNet, pBox );
    }
    Abc_NtkForEachPo( pNtkModel, pObj, i )
        pObj->pCopy = NULL;

    // remove the array of names, assign the pointer to the model
    Vec_PtrForEachEntry( char *, (Vec_Ptr_t *)pBox->pData, pName, i )
        ABC_FREE( pName );
    Vec_PtrFree( (Vec_Ptr_t *)pBox->pData );
    pBox->pData = pNtkModel;
    return 0;
}